

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::
eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::string_type_name(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *this)

{
  int iVar1;
  allocator<char> local_31;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  if (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::string_type_name()::string_type_name == '\0') {
    iVar1 = __cxa_guard_acquire(&eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::string_type_name()::string_type_name);
    if (iVar1 != 0) {
      local_30 = local_20;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"string","");
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (&string_type_name::string_type_name,(char_type *)local_30,local_28,none,&local_31);
      if (local_30 != local_20) {
        operator_delete(local_30,local_20[0] + 1);
      }
      __cxa_atexit(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   ~basic_json,&string_type_name::string_type_name,&__dso_handle);
      __cxa_guard_release(&eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::string_type_name()::string_type_name);
    }
  }
  return &string_type_name::string_type_name;
}

Assistant:

reference string_type_name()
        {
            static Json string_type_name(JSONCONS_STRING_CONSTANT(char_type, "string"));

            return string_type_name;
        }